

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall
QStyleSheetStyle::renderMenuItemIcon
          (QStyleSheetStyle *this,QStyleOptionMenuItem *mi,QPainter *p,QWidget *w,QRect *rect,
          QRenderRule *subRule)

{
  QSharedDataPointer<QStyleSheetGeometryData> *this_00;
  int iVar1;
  int iVar2;
  QStyleSheetGeometryData *ptr;
  long in_FS_OFFSET;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  QRect QVar12;
  QSize sz;
  QRenderRule iconRule;
  undefined1 local_108 [16];
  QSize local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  double local_d8;
  double dStack_d0;
  QRenderRule local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0 = (**(code **)(*(long *)this + 0xe0))(this,0x3e,mi,w);
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_dc = local_e0;
  QPainter::device();
  dVar3 = (double)QPaintDevice::devicePixelRatio();
  QIcon::pixmap(&local_f8,dVar3,(int)mi + 0x78,(State)&local_e0);
  iVar1 = QPixmap::width();
  uVar4 = QPixmap::devicePixelRatio();
  iVar2 = QPixmap::height();
  uVar5 = QPixmap::devicePixelRatio();
  auVar7._0_8_ = (double)iVar1;
  auVar7._8_8_ = (double)iVar2;
  auVar9._8_8_ = uVar5;
  auVar9._0_8_ = uVar4;
  auVar7 = divpd(auVar7,auVar9);
  iVar1 = (int)auVar7._0_8_;
  iVar2 = (int)auVar7._8_8_;
  memset(&local_c0,0xaa,0x88);
  renderRule(&local_c0,this,&w->super_QObject,&mi->super_QStyleOption,0x27);
  this_00 = &local_c0.geo;
  if (local_c0.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
    ptr = (QStyleSheetGeometryData *)operator_new(0x1c);
    (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 0;
    ptr->minWidth = iVar1;
    ptr->minHeight = iVar2;
    ptr->width = iVar1;
    ptr->height = iVar2;
    ptr->maxWidth = -1;
    ptr->maxHeight = -1;
    QSharedDataPointer<QStyleSheetGeometryData>::reset(this_00,ptr);
  }
  else {
    if (*(int *)local_c0.geo.d.ptr != 1) {
      QSharedDataPointer<QStyleSheetGeometryData>::detach_helper(this_00);
    }
    *(int *)((long)local_c0.geo.d.ptr + 0xc) = iVar1;
    if ((local_c0.geo.d.ptr != (QStyleSheetGeometryData *)0x0) && (*(int *)local_c0.geo.d.ptr != 1))
    {
      QSharedDataPointer<QStyleSheetGeometryData>::detach_helper(this_00);
    }
    *(int *)((long)local_c0.geo.d.ptr + 0x10) = iVar2;
  }
  local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVar12 = positionRect(this,w,subRule,&local_c0,0x27,rect,(mi->super_QStyleOption).direction);
  local_108 = (undefined1  [16])QVar12;
  QRenderRule::drawRule(&local_c0,p,(QRect *)local_108);
  auVar6._8_4_ = QVar12.y1.m_i.m_i;
  auVar6._0_8_ = QVar12._0_8_;
  auVar6._12_4_ = -(uint)(QVar12.y1.m_i.m_i < 0);
  auVar10._8_4_ = QVar12.y2.m_i.m_i;
  auVar10._0_8_ = QVar12._8_8_;
  auVar10._12_4_ = -(uint)(QVar12.y2.m_i.m_i < 0);
  uVar8 = CONCAT44(-(uint)(QVar12.x2.m_i.m_i < 0),QVar12.x2.m_i.m_i) +
          CONCAT44(-(uint)(QVar12.x1.m_i.m_i < 0),QVar12.x1.m_i.m_i);
  uVar11 = auVar10._8_8_ + auVar6._8_8_;
  local_d8 = (double)((int)((uVar8 >> 1) + (uVar8 >> 0x3f & uVar8)) - (iVar1 + -1) / 2);
  dStack_d0 = (double)((int)((uVar11 >> 1) + (uVar11 >> 0x3f & uVar11)) - (iVar2 + -1) / 2);
  QPainter::drawPixmap((QPointF *)p,(QPixmap *)&local_d8);
  QPainterPath::~QPainterPath(&local_c0.clipPath);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_c0.iconPtr);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_c0.img);
  if (local_c0.p.d.ptr != (QStyleSheetPositionData *)0x0) {
    LOCK();
    *(int *)local_c0.p.d.ptr = *(int *)local_c0.p.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_c0.p.d.ptr == 0) && (local_c0.p.d.ptr != (QStyleSheetPositionData *)0x0)) {
      operator_delete((void *)local_c0.p.d.ptr,0x24);
    }
  }
  if (local_c0.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
    LOCK();
    *(int *)local_c0.geo.d.ptr = *(int *)local_c0.geo.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_c0.geo.d.ptr == 0) && (local_c0.geo.d.ptr != (QStyleSheetGeometryData *)0x0))
    {
      operator_delete((void *)local_c0.geo.d.ptr,0x1c);
    }
  }
  QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_c0.ou);
  QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_c0.bd);
  QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_c0.bg);
  if (local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0) {
    LOCK();
    *(int *)local_c0.b.d.ptr = *(int *)local_c0.b.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_c0.b.d.ptr == 0) && (local_c0.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
      operator_delete((void *)local_c0.b.d.ptr,0x28);
    }
  }
  QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_c0.pal);
  QHash<QString,_QVariant>::~QHash(&local_c0.styleHints);
  QFont::~QFont(&local_c0.font);
  QBrush::~QBrush(&local_c0.defaultBackground);
  QPixmap::~QPixmap((QPixmap *)&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::renderMenuItemIcon(const QStyleOptionMenuItem *mi, QPainter *p, const QWidget *w,
                                          const QRect &rect, QRenderRule &subRule) const
{
    const QIcon::Mode mode = mi->state & QStyle::State_Enabled
                           ? (mi->state & QStyle::State_Selected ? QIcon::Active : QIcon::Normal)
                           : QIcon::Disabled;
    const bool checked = mi->checkType != QStyleOptionMenuItem::NotCheckable && mi->checked;
    const auto iconSize = pixelMetric(PM_SmallIconSize, mi, w);
    const QSize sz(iconSize, iconSize);
    const QPixmap pixmap(mi->icon.pixmap(sz, QStyleHelper::getDpr(p), mode,
                        checked ? QIcon::On : QIcon::Off));
    const int pixw = pixmap.width() / pixmap.devicePixelRatio();
    const int pixh = pixmap.height() / pixmap.devicePixelRatio();
    QRenderRule iconRule = renderRule(w, mi, PseudoElement_MenuIcon);
    if (!iconRule.hasGeometry()) {
        iconRule.geo = new QStyleSheetGeometryData(pixw, pixh, pixw, pixh, -1, -1);
    } else {
        iconRule.geo->width = pixw;
        iconRule.geo->height = pixh;
    }
    QRect iconRect = positionRect(w, subRule, iconRule, PseudoElement_MenuIcon, rect, mi->direction);
    if (mi->direction == Qt::LeftToRight)
        iconRect.moveLeft(iconRect.left());
    else
        iconRect.moveRight(iconRect.right());
    iconRule.drawRule(p, iconRect);
    QRect pmr(0, 0, pixw, pixh);
    pmr.moveCenter(iconRect.center());
    p->drawPixmap(pmr.topLeft(), pixmap);
}